

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O1

unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
 duckdb::ParquetMultiFileInfo::InitializeLocalState
           (ExecutionContext *param_1,GlobalTableFunctionState *param_2)

{
  ClientContext *__s;
  
  __s = (ClientContext *)operator_new(0xf8);
  switchD_01306cb1::default(__s,0,0xf8);
  (__s->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__ParquetReadLocalState_024bd980;
  ParquetReaderScanState::ParquetReaderScanState
            ((ParquetReaderScanState *)
             &(__s->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  param_1->client = __s;
  return (unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
          )(unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
            )param_1;
}

Assistant:

unique_ptr<LocalTableFunctionState> ParquetMultiFileInfo::InitializeLocalState(ExecutionContext &,
                                                                               GlobalTableFunctionState &) {
	return make_uniq<ParquetReadLocalState>();
}